

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O3

int stb__hashfind(void *p)

{
  int iVar1;
  uint uVar2;
  uint uVar3;
  uint x;
  void *pvVar4;
  
  iVar1 = ((uint)((ulong)p >> 0x13) & 0x1fff) + ((uint)((ulong)p >> 6) & 0x3ffffff) + (int)p;
  uVar2 = iVar1 * 0x80008 ^ iVar1 * 0x10001;
  uVar2 = (uVar2 >> 5) + uVar2;
  uVar2 = uVar2 * 4 ^ uVar2;
  uVar2 = (uVar2 >> 0xf) + uVar2;
  uVar2 = uVar2 * 0x400 ^ uVar2;
  uVar3 = (uVar2 >> 0x13) + (uVar2 >> 6) + uVar2;
  uVar2 = stb__alloc_mask & uVar3;
  pvVar4 = stb__allocations[(int)uVar2].p;
  if (pvVar4 != p) {
    do {
      if (pvVar4 == (void *)0x0) {
        return -1;
      }
      uVar2 = uVar2 + ((uVar3 >> 0x13) + (uVar3 >> 6) + uVar3 | 1) & stb__alloc_mask;
      pvVar4 = stb__allocations[(int)uVar2].p;
    } while (pvVar4 != p);
  }
  return uVar2;
}

Assistant:

unsigned int stb_hashptr(void *p)
{
   unsigned int x = (unsigned int) p;

   // typically lacking in low bits and high bits
   x = stb_rehash(x);
   x += x << 16;

   // pearson's shuffle
   x ^= x << 3;
   x += x >> 5;
   x ^= x << 2;
   x += x >> 15;
   x ^= x << 10;
   return stb_rehash(x);
}